

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<std::shared_ptr<i2>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1_2,_std::shared_ptr<impl1_2>_&>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,boost::ext::di::v1_3_0::concepts::any_of<i2,i1>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,std::shared_ptr<i2>,boost::ext::di::v1_3_0::no_name>
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_boost::ext::di::v1_3_0::concepts::any_of<i2,_i1>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
           *this)

{
  shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1_2,_std::shared_ptr<impl1_2>_&> sVar1;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_boost::ext::di::v1_3_0::concepts::any_of<i2,_i1>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_boost::ext::di::v1_3_0::concepts::any_of<i2,_i1>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::singleton,_boost::ext::di::v1_3_0::concepts::any_of<i2,_i1>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  scope_impl<impl1_2,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
  *in_stack_ffffffffffffffc8;
  
  binder::
  resolve<std::shared_ptr<i2>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i2,i2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,boost::ext::di::v1_3_0::concepts::any_of<i2,i1>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
            (in_RDI);
  sVar1 = scopes::singleton::
          scope_impl<impl1_2,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
          create<std::shared_ptr<i2>,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<impl1_2,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,boost::ext::di::v1_3_0::concepts::any_of<i2,i1>,impl1_2,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
                    (in_stack_ffffffffffffffc8,
                     (provider<boost::ext::di::v1_3_0::aux::pair<impl1_2,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_boost::ext::di::v1_3_0::concepts::any_of<i2,_i1>,_impl1_2,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                      *)0x132933);
  return (wrapper<std::shared_ptr<i2>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1_2,_std::shared_ptr<impl1_2>_&>_>
          )(shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1_2,_std::shared_ptr<impl1_2>_&>)
           sVar1.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }